

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

int llvm::APInt::tcDivide(WordType *lhs,WordType *rhs,WordType *remainder,WordType *srhs,uint parts)

{
  uint uVar1;
  int iVar2;
  uint Count;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint local_44;
  
  if (((remainder != srhs) && (lhs != remainder)) && (lhs != srhs)) {
    uVar1 = tcMSB(rhs,parts);
    if (uVar1 + 1 == 0) {
      iVar3 = 1;
    }
    else {
      Count = parts * 0x40 - (uVar1 + 1);
      local_44 = Count >> 6;
      tcAssign(srhs,rhs,parts);
      tcShiftLeft(srhs,parts,Count);
      tcAssign(remainder,lhs,parts);
      tcSet(lhs,0,parts);
      iVar3 = uVar1 + parts * -0x40;
      uVar5 = 1L << ((byte)Count & 0x3f);
      while( true ) {
        iVar3 = iVar3 + 1;
        iVar2 = tcCompare(remainder,srhs,parts);
        if (-1 < iVar2) {
          tcSubtract(remainder,srhs,0,parts);
          lhs[local_44] = lhs[local_44] | uVar5;
        }
        if (iVar3 == 0) break;
        uVar4 = uVar5 >> 1;
        local_44 = local_44 - (uVar5 < 2);
        if (uVar5 < 2) {
          uVar4 = 0x8000000000000000;
        }
        tcShiftRight(srhs,parts,1);
        uVar5 = uVar4;
      }
      iVar3 = 0;
    }
    return iVar3;
  }
  __assert_fail("lhs != remainder && lhs != srhs && remainder != srhs",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x9d7,
                "static int llvm::APInt::tcDivide(WordType *, const WordType *, WordType *, WordType *, unsigned int)"
               );
}

Assistant:

int APInt::tcDivide(WordType *lhs, const WordType *rhs,
                    WordType *remainder, WordType *srhs,
                    unsigned parts) {
  assert(lhs != remainder && lhs != srhs && remainder != srhs);

  unsigned shiftCount = tcMSB(rhs, parts) + 1;
  if (shiftCount == 0)
    return true;

  shiftCount = parts * APINT_BITS_PER_WORD - shiftCount;
  unsigned n = shiftCount / APINT_BITS_PER_WORD;
  WordType mask = (WordType) 1 << (shiftCount % APINT_BITS_PER_WORD);

  tcAssign(srhs, rhs, parts);
  tcShiftLeft(srhs, parts, shiftCount);
  tcAssign(remainder, lhs, parts);
  tcSet(lhs, 0, parts);

  /* Loop, subtracting SRHS if REMAINDER is greater and adding that to
     the total.  */
  for (;;) {
    int compare = tcCompare(remainder, srhs, parts);
    if (compare >= 0) {
      tcSubtract(remainder, srhs, 0, parts);
      lhs[n] |= mask;
    }

    if (shiftCount == 0)
      break;
    shiftCount--;
    tcShiftRight(srhs, parts, 1);
    if ((mask >>= 1) == 0) {
      mask = (WordType) 1 << (APINT_BITS_PER_WORD - 1);
      n--;
    }
  }

  return false;
}